

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O2

Interpolation __thiscall tinyusdz::GeomMesh::get_normalsInterpolation(GeomMesh *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *this_00;
  bool bVar1;
  size_type sVar2;
  mapped_type *this_01;
  value_type *pvVar3;
  optional<tinyusdz::Interpolation> *this_02;
  allocator local_49;
  key_type local_48;
  
  this_00 = &(this->super_GPrim).props;
  std::__cxx11::string::string((string *)&local_48,"primvars:normals",&local_49);
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
          ::count(this_00,&local_48);
  std::__cxx11::string::_M_dispose();
  if (sVar2 == 0) {
    if ((this->normals)._metas.interpolation.has_value_ != true) {
      return Vertex;
    }
    this_02 = (optional<tinyusdz::Interpolation> *)&this->normals;
  }
  else {
    std::__cxx11::string::string((string *)&local_48,"primvars:normals",&local_49);
    this_01 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
              ::at(this_00,&local_48);
    std::__cxx11::string::_M_dispose();
    Attribute::type_name_abi_cxx11_(&local_48,&this_01->_attrib);
    bVar1 = std::operator==(&local_48,"normal3f[]");
    std::__cxx11::string::_M_dispose();
    if (!bVar1) {
      return Vertex;
    }
    if ((this_01->_attrib)._metas.interpolation.has_value_ == false) {
      return Vertex;
    }
    this_02 = &(this_01->_attrib)._metas.interpolation;
  }
  pvVar3 = nonstd::optional_lite::optional<tinyusdz::Interpolation>::value(this_02);
  return *pvVar3;
}

Assistant:

Interpolation GeomMesh::get_normalsInterpolation() const {
  if (props.count("primvars:normals")) {
    const auto &prop = props.at("primvars:normals");
    if (prop.get_attribute().type_name() == "normal3f[]") {
      if (prop.get_attribute().metas().interpolation) {
        return prop.get_attribute().metas().interpolation.value();
      }
    }
  } else if (normals.metas().interpolation) {
    return normals.metas().interpolation.value();
  }

  return Interpolation::Vertex;  // default 'vertex'
}